

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O1

void idx2::Dealloc<unsigned_long,idx2::chunk_exp_info>
               (hash_table<unsigned_long,_idx2::chunk_exp_info> *Ht)

{
  buffer local_30;
  
  local_30.Alloc = Ht->Alloc;
  if (local_30.Alloc != (allocator *)0x0) {
    local_30.Data = (byte *)Ht->Keys;
    local_30.Bytes = 1;
    DeallocBuf(&local_30);
    local_30.Alloc = Ht->Alloc;
    local_30.Data = (byte *)Ht->Vals;
    local_30.Bytes = 1;
    DeallocBuf(&local_30);
    local_30.Alloc = Ht->Alloc;
    local_30.Data = Ht->Stats;
    local_30.Bytes = 1;
    DeallocBuf(&local_30);
    Ht->Size = 0;
    Ht->LogCapacity = 0;
    Ht->Alloc = (allocator *)0x0;
  }
  return;
}

Assistant:

void
Dealloc(hash_table<k, v>* Ht)
{
  if (Ht->Alloc)
  {
    DeallocPtr(&Ht->Keys, Ht->Alloc);
    DeallocPtr(&Ht->Vals, Ht->Alloc);
    DeallocPtr(&Ht->Stats, Ht->Alloc);
    Ht->Size = Ht->LogCapacity = 0;
    Ht->Alloc = nullptr;
  }
}